

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

cf_filetype_t cf_file_type(cf_char_t *path)

{
  int iVar1;
  uint uVar2;
  undefined1 local_a8 [8];
  stat st;
  cf_char_t *path_local;
  
  if (path == (cf_char_t *)0x0) {
    path_local._4_4_ = CF_FILE_TYPE_UNKNOWN;
  }
  else {
    st.__glibc_reserved[2] = (__syscall_slong_t)path;
    iVar1 = stat(path,(stat *)local_a8);
    if (iVar1 == 0) {
      uVar2 = (uint)st.st_nlink & 0xf000;
      if (uVar2 == 0x1000) {
        path_local._4_4_ = CF_FILE_TYPE_PIPE;
      }
      else if (uVar2 == 0x2000) {
        path_local._4_4_ = CF_FILE_TYPE_CHAR;
      }
      else if (uVar2 == 0x4000) {
        path_local._4_4_ = CF_FILE_TYPE_DIR;
      }
      else if (uVar2 == 0x6000) {
        path_local._4_4_ = CF_FILE_TYPE_BLOCK;
      }
      else if (uVar2 == 0x8000) {
        path_local._4_4_ = CF_FILE_TYPE_REGULAR;
      }
      else if (uVar2 == 0xa000) {
        path_local._4_4_ = CF_FILE_TYPE_LINK;
      }
      else if (uVar2 == 0xc000) {
        path_local._4_4_ = CF_FILE_TYPE_SOCK;
      }
      else {
        path_local._4_4_ = CF_FILE_TYPE_NOT_DEF;
      }
    }
    else {
      path_local._4_4_ = CF_FILE_TYPE_UNKNOWN;
    }
  }
  return path_local._4_4_;
}

Assistant:

cf_filetype_t cf_file_type(const cf_char_t* path) {
    struct stat st;
    if(!path) return CF_FILE_TYPE_UNKNOWN;

    if(stat(path, &st) != 0) return CF_FILE_TYPE_UNKNOWN;
    
    switch(st.st_mode & S_IFMT) {
#ifndef CF_OS_WIN
    case S_IFSOCK:
        return CF_FILE_TYPE_SOCK;
    case S_IFLNK: 
        return CF_FILE_TYPE_LINK;
#endif
    case S_IFREG: 
        return CF_FILE_TYPE_REGULAR;
#ifndef CF_OS_WIN
    case S_IFBLK: 
        return CF_FILE_TYPE_BLOCK;
#endif
    case S_IFDIR: 
        return CF_FILE_TYPE_DIR;
    case S_IFCHR: 
        return CF_FILE_TYPE_CHAR;
#ifndef CF_OS_WIN
    case S_IFIFO: 
        return CF_FILE_TYPE_PIPE;
#endif
    default: 
        return CF_FILE_TYPE_NOT_DEF;
    }
}